

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

float anon_unknown.dwarf_580a1::mapPointToOutside
                (PolylineSegmentedPathwaySegmentRadii *pathway,Vec3 *point)

{
  float fVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type segmentIndex;
  size_type segmentIndex_00;
  float fVar3;
  Vec3 VVar4;
  float distancePointToPath;
  float local_70;
  float local_6c;
  float radius;
  float segmentDistance;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  iVar2 = (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  local_6c = 3.4028235e+38;
  local_70 = 0.0;
  for (segmentIndex_00 = 0; CONCAT44(extraout_var,iVar2) != segmentIndex_00;
      segmentIndex_00 = segmentIndex_00 + 1) {
    segmentDistance = 0.0;
    radius = 0.0;
    distancePointToPath = 0.0;
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    OpenSteer::
    PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySegmentRadii>::
    extract(pathway,segmentIndex_00,point,&segmentDistance,&radius,&distancePointToPath,&local_40,
            &local_50);
    fVar3 = distancePointToPath;
    fVar1 = local_6c;
    if (distancePointToPath < local_6c) {
      local_6c = distancePointToPath;
      local_60 = OpenSteer::Vec3::operator-(point,&local_40);
      VVar4 = OpenSteer::Vec3::normalize(&local_60);
      fVar3 = VVar4.z;
      local_70 = distancePointToPath;
      fVar1 = distancePointToPath;
    }
    (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])
              ((ulong)(uint)fVar1,fVar3,pathway,segmentIndex_00);
  }
  return local_70;
}

Assistant:

float mapPointToOutside( OpenSteer::PolylineSegmentedPathwaySegmentRadii const& pathway, OpenSteer::Vec3 const& point ) {
        PointToOutsideMapping mapping;
        OpenSteer::mapPointToPathAlike( pathway, point, mapping);
        return mapping.distancePointToPathBoundary;    
    }